

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts5ExprAddChildren(Fts5ExprNode *p,Fts5ExprNode *pSub)

{
  int iVar1;
  int iVar2;
  long lVar3;
  
  iVar1 = p->nChild;
  lVar3 = (long)iVar1;
  if ((p->eType == 3) || (pSub->eType != p->eType)) {
    p->nChild = iVar1 + 1;
    p->apChild[lVar3] = pSub;
  }
  else {
    memcpy(p->apChild + lVar3,pSub->apChild,(long)(pSub->nChild << 3));
    p->nChild = p->nChild + pSub->nChild;
    sqlite3_free(pSub);
  }
  if (iVar1 < p->nChild) {
    iVar1 = p->iHeight;
    do {
      iVar2 = p->apChild[lVar3]->iHeight + 1;
      if (iVar1 <= iVar2) {
        iVar1 = iVar2;
      }
      p->iHeight = iVar1;
      lVar3 = lVar3 + 1;
    } while (p->nChild != lVar3);
  }
  return;
}

Assistant:

static void fts5ExprAddChildren(Fts5ExprNode *p, Fts5ExprNode *pSub){
  int ii = p->nChild;
  if( p->eType!=FTS5_NOT && pSub->eType==p->eType ){
    int nByte = sizeof(Fts5ExprNode*) * pSub->nChild;
    memcpy(&p->apChild[p->nChild], pSub->apChild, nByte);
    p->nChild += pSub->nChild;
    sqlite3_free(pSub);
  }else{
    p->apChild[p->nChild++] = pSub;
  }
  for( ; ii<p->nChild; ii++){
    p->iHeight = MAX(p->iHeight, p->apChild[ii]->iHeight + 1);
  }
}